

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O1

void __thiscall
btGeneric6DofSpring2Constraint::calculateJacobi
          (btGeneric6DofSpring2Constraint *this,btRotationalLimitMotor2 *limot,btTransform *transA,
          btTransform *transB,btConstraintInfo2 *info,int srow,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btScalar *pbVar3;
  btScalar *pbVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 local_10 [16];
  undefined8 uVar10;
  
  bVar7 = rotational != 0;
  pbVar3 = (&info->m_J1linearAxis)[bVar7];
  pbVar4 = (&info->m_J2linearAxis)[bVar7];
  lVar5 = (long)srow;
  pbVar3[lVar5] = ax1->m_floats[0];
  pbVar3[lVar5 + 1] = ax1->m_floats[1];
  pbVar3[lVar5 + 2] = ax1->m_floats[2];
  pbVar4[lVar5] = -ax1->m_floats[0];
  pbVar4[lVar5 + 1] = -ax1->m_floats[1];
  pbVar4[lVar5 + 2] = -ax1->m_floats[2];
  if (!bVar7) {
    fVar13 = (this->m_calculatedTransformB).m_origin.m_floats[0] - (transB->m_origin).m_floats[0];
    fVar12 = (this->m_calculatedTransformA).m_origin.m_floats[0] - (transA->m_origin).m_floats[0];
    fVar14 = ax1->m_floats[0];
    uVar1 = *(undefined8 *)((this->m_calculatedTransformA).m_origin.m_floats + 1);
    uVar2 = *(undefined8 *)((transA->m_origin).m_floats + 1);
    fVar8 = (float)uVar1 - (float)uVar2;
    fVar11 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
    fVar15 = (float)*(undefined8 *)(ax1->m_floats + 1);
    fVar16 = (float)((ulong)*(undefined8 *)(ax1->m_floats + 1) >> 0x20);
    fVar9 = fVar8 * fVar16 - fVar11 * fVar15;
    fVar11 = fVar11 * fVar14 - fVar12 * fVar16;
    uVar10 = CONCAT44(fVar11,fVar9);
    fVar8 = fVar12 * fVar15 - fVar14 * fVar8;
    uVar1 = *(undefined8 *)((this->m_calculatedTransformB).m_origin.m_floats + 1);
    uVar2 = *(undefined8 *)((transB->m_origin).m_floats + 1);
    fVar17 = (float)uVar1 - (float)uVar2;
    fVar18 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
    fVar12 = fVar16 * fVar17 - fVar18 * fVar15;
    fVar16 = fVar14 * fVar18 - fVar13 * fVar16;
    fVar14 = fVar13 * fVar15 - fVar17 * fVar14;
    local_10._4_4_ = fVar16;
    local_10._0_4_ = fVar12;
    local_10._8_4_ = fVar14;
    local_10._12_4_ = 0;
    if ((rotAllowed == 0) && (this->m_hasStaticBody != false)) {
      fVar13 = this->m_factA;
      fVar15 = this->m_factB;
      fVar8 = fVar8 * fVar13;
      uVar10 = CONCAT44(fVar11 * fVar13,fVar9 * fVar13);
      local_10._4_4_ = fVar15 * fVar16;
      local_10._0_4_ = fVar15 * fVar12;
      local_10._8_4_ = fVar15 * fVar14;
      local_10._12_4_ = 0;
    }
    pbVar3 = info->m_J1angularAxis;
    *(undefined8 *)(pbVar3 + lVar5) = uVar10;
    pbVar3[lVar5 + 2] = fVar8;
    pbVar3 = info->m_J2angularAxis;
    lVar6 = 0;
    do {
      pbVar3[lVar5 + lVar6] = -*(btScalar *)(local_10 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateJacobi(btRotationalLimitMotor2 * limot, const btTransform& transA,const btTransform& transB, btConstraintInfo2 *info, int srow, btVector3& ax1, int rotational, int rotAllowed)
{
	btScalar *J1 = rotational ? info->m_J1angularAxis : info->m_J1linearAxis;
	btScalar *J2 = rotational ? info->m_J2angularAxis : info->m_J2linearAxis;

	J1[srow+0] = ax1[0];
	J1[srow+1] = ax1[1];
	J1[srow+2] = ax1[2];

	J2[srow+0] = -ax1[0];
	J2[srow+1] = -ax1[1];
	J2[srow+2] = -ax1[2];

	if(!rotational)
	{
		btVector3 tmpA, tmpB, relA, relB;
		// get vector from bodyB to frameB in WCS
		relB = m_calculatedTransformB.getOrigin() - transB.getOrigin();
		// same for bodyA
		relA = m_calculatedTransformA.getOrigin() - transA.getOrigin();
		tmpA = relA.cross(ax1);
		tmpB = relB.cross(ax1);
		if(m_hasStaticBody && (!rotAllowed))
		{
			tmpA *= m_factA;
			tmpB *= m_factB;
		}
		int i;
		for (i=0; i<3; i++) info->m_J1angularAxis[srow+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[srow+i] = -tmpB[i];
	}
}